

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O1

fio_str_info_s * fio_io2str(fio_str_info_s *__return_storage_ptr__,FIOBJ o)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  size_t __nbytes;
  stat sStack_a8;
  
  if (*(int *)(o + 0x30) == -2) {
    fiobj_data_pread(__return_storage_ptr__,*(FIOBJ *)(o + 0x10),*(intptr_t *)(o + 0x18),
                     *(uintptr_t *)(o + 0x20));
    return __return_storage_ptr__;
  }
  if (*(int *)(o + 0x30) != -1) {
    do {
      iVar1 = fstat(*(int *)(o + 0x30),&sStack_a8);
      __nbytes = sStack_a8.st_size;
      if (iVar1 == 0) goto LAB_0011c307;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    __nbytes = 0xffffffffffffffff;
LAB_0011c307:
    if (0 < (long)__nbytes) {
      *(undefined8 *)(o + 0x20) = 0;
      *(undefined8 *)(o + 0x28) = 0;
      fiobj_data_pre_write(o,__nbytes + 1);
      sVar3 = pread(*(int *)(o + 0x30),*(void **)(o + 8),__nbytes,0);
      if (sVar3 != __nbytes) {
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = 0;
        __return_storage_ptr__->data = (char *)0x0;
        return __return_storage_ptr__;
      }
      *(undefined1 *)(*(long *)(o + 8) + __nbytes) = 0;
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = __nbytes;
      goto LAB_0011c35c;
    }
  }
  __return_storage_ptr__->capa = 0;
  __return_storage_ptr__->len = *(size_t *)(o + 0x20);
LAB_0011c35c:
  __return_storage_ptr__->data = *(char **)(o + 8);
  return __return_storage_ptr__;
}

Assistant:

static fio_str_info_s fio_io2str(const FIOBJ o) {
  switch (obj2io(o)->fd) {
  case -1:
    return (fio_str_info_s){.data = (char *)obj2io(o)->buffer,
                            .len = obj2io(o)->len};
    break;
  case -2:
    return fiobj_data_pread(obj2io(o)->source.parent, obj2io(o)->capa,
                            obj2io(o)->len);
    break;
  }
  int64_t i = fiobj_data_get_fd_size(o);
  if (i <= 0)
    return (fio_str_info_s){.data = (char *)obj2io(o)->buffer,
                            .len = obj2io(o)->len};
  obj2io(o)->len = 0;
  obj2io(o)->pos = 0;
  fiobj_data_pre_write((FIOBJ)o, i + 1);
  if (pread(obj2io(o)->fd, obj2io(o)->buffer, i, 0) != i)
    return (fio_str_info_s){.data = NULL, .len = 0};
  obj2io(o)->buffer[i] = 0;
  return (fio_str_info_s){.data = (char *)obj2io(o)->buffer, .len = i};
}